

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleZomby.cpp
# Opt level: O0

shared_ptr<SimpleZomby::Zomby> SimpleZomby::Zomby::create(void)

{
  Zomby *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<SimpleZomby::Zomby> sVar1;
  
  this = (Zomby *)operator_new(0x38);
  Zomby(this);
  std::shared_ptr<SimpleZomby::Zomby>::shared_ptr<SimpleZomby::Zomby,void>
            ((shared_ptr<SimpleZomby::Zomby> *)in_RDI,this);
  sVar1.super___shared_ptr<SimpleZomby::Zomby,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<SimpleZomby::Zomby,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<SimpleZomby::Zomby>)
         sVar1.super___shared_ptr<SimpleZomby::Zomby,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Zomby> Zomby::create()
{
    return std::shared_ptr<Zomby>(new Zomby());
}